

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_byte_string(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                 byte_string_view *b,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  undefined1 *puVar2;
  _Base_ptr *pp_Var3;
  ulong uVar4;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *pbVar5;
  pointer psVar6;
  char cVar7;
  uint8_t ch;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  undefined1 uVar8;
  uint uVar9;
  int *piVar10;
  iterator iVar11;
  pointer __dest;
  ser_context *n;
  byte bVar13;
  ulong uVar12;
  ser_context *unaff_RBX;
  ulong unaff_RBP;
  cbor_errc __e;
  error_category *unaff_R12;
  error_category *peVar14;
  undefined8 unaff_R13;
  char *unaff_R14;
  size_t unaff_R15;
  size_t __n;
  size_t sVar15;
  long in_FS_OFFSET;
  type tVar16;
  error_code eVar17;
  void *unaff_retaddr;
  byte_string_type bs;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000028;
  void *in_stack_00000030;
  int64_t in_stack_00000038;
  undefined7 uStack_68;
  byte local_61;
  error_code *local_60;
  detail *local_58;
  char *local_50;
  pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long> local_48;
  
  uVar12 = 0x300000201U >> ((tag - base16) * '\b' & 0x3f) & 0xffffffff;
  if (4 < (byte)(tag - base16)) {
    uVar12 = 0;
  }
  piVar10 = (int *)((long)&switchD_00291285::switchdataD_0082ab8c +
                   (long)(int)(&switchD_00291285::switchdataD_0082ab8c)[uVar12 & 0xff]);
  bVar13 = (byte)(uVar12 >> 8);
  cVar7 = (char)piVar10;
  uVar9 = (uint)piVar10;
  __e = (cbor_errc)b;
  peVar14 = unaff_R12;
  sVar15 = unaff_R15;
  switch(uVar12 & 0xff) {
  case 0:
    goto switchD_00291285_caseD_0;
  case 1:
    ch = 0xd7;
    goto LAB_00291291;
  case 2:
    ch = 0xd6;
    goto LAB_00291291;
  case 3:
    ch = 0xd5;
LAB_00291291:
    binary_stream_sink::push_back(&this->sink_,ch);
switchD_00291285_caseD_0:
    if ((this->options_).use_stringref_ == true) {
      uVar4 = this->next_stringref_;
      uVar12 = 3;
      if (((0x17 < uVar4) && (uVar12 = 4, 0xff < uVar4)) && (uVar12 = 5, 0xffff < uVar4)) {
        uVar12 = (ulong)(uVar4 >> 0x20 != 0) * 4 + 7;
      }
      if (uVar12 <= b->size_) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_60,b->data_,
                   b->data_ + b->size_,(allocator_type *)&local_48);
        iVar11 = std::
                 _Rb_tree<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
                 ::find(&(this->bytestringref_map_)._M_t,(key_type *)&local_60);
        if ((_Rb_tree_header *)iVar11._M_node ==
            &(this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header) {
          pbVar5 = (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                   this->next_stringref_;
          this->next_stringref_ =
               (size_t)((long)&(pbVar5->super_basic_json_visitor<char>)._vptr_basic_json_visitor + 1
                       );
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar12 = (long)local_58 - (long)local_60;
          if (uVar12 == 0) {
            __dest = (pointer)0x0;
          }
          else {
            if ((long)uVar12 < 0) {
              std::__throw_bad_alloc();
            }
            __dest = (pointer)operator_new(uVar12);
          }
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar12;
          __n = (long)local_58 - (long)local_60;
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = __dest;
          if (__n != 0) {
            local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = __dest;
            memmove(__dest,local_60,__n);
          }
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
          local_48.second = (unsigned_long)pbVar5;
          std::
          _Rb_tree<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>,std::_Select1st<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>,std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>>>,std::allocator<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>>
          ::
          _M_emplace_unique<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,unsigned_long>>
                    ((_Rb_tree<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>,std::_Select1st<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>,std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>>>,std::allocator<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>>
                      *)&this->bytestringref_map_,&local_48);
          if (local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.first.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.first.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.first.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_60;
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(local_58 + -(long)local_60);
          write_byte_string(this,(byte_string_view *)&local_48);
        }
        else {
          binary_stream_sink::push_back(&this->sink_,0xd8);
          binary_stream_sink::push_back(&this->sink_,'\x19');
          write_uint64_value(this,(uint64_t)iVar11._M_node[1]._M_right);
        }
        if (local_60 != (error_code *)0x0) {
          operator_delete(local_60,(long)local_50 - (long)local_60);
        }
        goto LAB_002912f4;
      }
    }
    write_byte_string(this,b);
LAB_002912f4:
    psVar6 = (this->stack_).
             super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stack_).
        super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar6) {
      psVar1 = &psVar6[-1].index_;
      *psVar1 = *psVar1 + 1;
    }
    return true;
  case 4:
    uVar8 = (*(code *)(unaff_R13 + (long)*(int *)(unaff_R13 + (unaff_RBP & 0xffffffff) * 4)))();
    return (bool)uVar8;
  case 5:
    *(char *)piVar10 = (char)*piVar10 + cVar7;
    std::error_code::operator=((error_code *)this,__e);
    break;
  case 6:
    uVar9 = uVar9 + *piVar10;
    *(char *)(ulong)uVar9 = *(char *)(ulong)uVar9 + (char)uVar9;
    std::error_code::operator=((error_code *)this,__e);
    break;
  case 7:
    *(char *)piVar10 = (char)*piVar10 + cVar7;
    std::error_code::operator=((error_code *)this,__e);
    break;
  case 8:
    std::error_code::operator=
              ((error_code *)((ulong)local_60 & 0xffffffff),invalid_decimal_fraction);
    break;
  case 9:
    cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::typeinfo_name.
    _8_4_ = uVar9 + 0x6334736e;
    *(int *)&b->data_ = *(int *)&b->data_ + 1;
    do {
      unaff_RBP = 1;
      if ((uint)sVar15 < 7) {
        uVar8 = (*(code *)((long)&(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor +
                          (long)*(int *)((long)&(this->super_basic_json_visitor<char>).
                                                _vptr_basic_json_visitor + (sVar15 & 0xffffffff) * 4
                                        )))();
        return (bool)uVar8;
      }
LAB_00292f41:
      if ((char)unaff_RBP == '\0') break;
      peVar14 = peVar14 + 1;
      b = (byte_string_view *)(ulong)((error_category *)unaff_R13 == peVar14);
    } while ((error_category *)unaff_R13 != peVar14);
    if (((ulong)b & 1) != 0) {
      binary_stream_sink::push_back(&in_stack_00000028->sink_,0xc5);
      n = (ser_context *)
          local_48.first.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
      visit_begin_array(in_stack_00000028,2,none,
                        (ser_context *)
                        local_48.first.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (error_code *)CONCAT17(local_61,uStack_68));
      if (*(int *)CONCAT17(local_61,uStack_68) == 0) {
        if (bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          local_48.second = 0;
          tVar16 = detail::hex_to_integer<long,char>
                             ((detail *)
                              bs.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (char *)bs.data_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                              (size_t)&local_48.second,(long *)n);
          unaff_R12 = (error_category *)tVar16.ptr;
          unaff_R13._1_7_ = (undefined7)((ulong)unaff_R13 >> 8);
          unaff_R13._0_1_ = tVar16.ec;
          if (tVar16.ec != success) {
            eVar17 = detail::to_integer_result<long,_char>::error_code
                               ((to_integer_result<long,_char> *)&stack0xffffffffffffffe0);
            *(int *)CONCAT17(local_61,uStack_68) = eVar17._M_value;
            *(error_category **)((int *)CONCAT17(local_61,uStack_68) + 2) = eVar17._M_cat;
            goto LAB_00293100;
          }
          local_60 = (error_code *)
                     ((long)&((basic_json_visitor<char> *)local_48.second)->_vptr_basic_json_visitor
                     + (long)&local_60->_M_value);
        }
        write_int64_value(in_stack_00000028,(int64_t)local_60);
        psVar6 = (in_stack_00000028->stack_).
                 super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((in_stack_00000028->stack_).
            super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
            ._M_impl.super__Vector_impl_data._M_start != psVar6) {
          psVar1 = &psVar6[-1].index_;
          *psVar1 = *psVar1 + 1;
        }
        if (*(int *)CONCAT17(local_61,uStack_68) == 0) {
          in_stack_00000038 = 0;
          tVar16 = detail::hex_to_integer<long,char>
                             (local_58,local_50,(size_t)&stack0x00000038,(long *)n);
          local_48.second = (unsigned_long)tVar16.ptr;
          if (tVar16.ec == success) {
            write_int64_value(in_stack_00000028,in_stack_00000038);
            psVar6 = (in_stack_00000028->stack_).
                     super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((in_stack_00000028->stack_).
                super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                ._M_impl.super__Vector_impl_data._M_start != psVar6) {
              psVar1 = &psVar6[-1].index_;
              *psVar1 = *psVar1 + 1;
            }
            if (*(int *)CONCAT17(local_61,uStack_68) != 0) goto LAB_00293100;
          }
          else {
            eVar17 = detail::to_integer_result<long,_char>::error_code
                               ((to_integer_result<long,_char> *)&local_48.second);
            std::error_code::error_code<jsoncons::detail::to_integer_errc,void>
                      ((error_code *)&stack0xffffffffffffffe0,overflow);
            if ((eVar17._M_cat != (error_category *)unaff_R13) ||
               (eVar17._M_value != (int)unaff_R12)) {
              eVar17 = detail::to_integer_result<long,_char>::error_code
                                 ((to_integer_result<long,_char> *)&local_48.second);
              *(int *)CONCAT17(local_61,uStack_68) = eVar17._M_value;
              *(error_category **)((int *)CONCAT17(local_61,uStack_68) + 2) = eVar17._M_cat;
              goto LAB_00293100;
            }
            basic_bigint<std::allocator<unsigned_char>_>::from_string_radix<char>
                      ((basic_bigint<std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0,
                       (char *)local_58,(size_type)local_50,'\x10');
            write_bignum(in_stack_00000028,(bigint *)&stack0xffffffffffffffe0);
            psVar6 = (in_stack_00000028->stack_).
                     super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((in_stack_00000028->stack_).
                super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                ._M_impl.super__Vector_impl_data._M_start != psVar6) {
              psVar1 = &psVar6[-1].index_;
              *psVar1 = *psVar1 + 1;
            }
            if (((unaff_R13 & 1) != 0) && (unaff_retaddr != (void *)0x0)) {
              operator_delete(unaff_retaddr,unaff_R15 << 3);
            }
          }
          visit_end_array(in_stack_00000028,
                          (ser_context *)
                          local_48.first.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                          (error_code *)CONCAT17(local_61,uStack_68));
        }
      }
    }
LAB_00293100:
    basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::write_hexfloat_value();
    return (bool)extraout_AL_00;
  case 10:
    piVar10 = (int *)((long)&UINT_0082ab98 +
                     (long)(int)(&switchD_00291285::switchdataD_0082ab8c)[uVar12 & 0xff] + 3);
    *piVar10 = *piVar10 + 0x82ab8c;
    _DAT_41000000eb830fca = uVar9;
    std::__cxx11::string::push_back((char)&local_58);
    goto LAB_00292f41;
  case 0xb:
    *(char *)piVar10 = (char)*piVar10 + cVar7;
    sVar15 = 4;
    std::error_code::operator=((error_code *)CONCAT17(local_61,uStack_68),invalid_bigfloat);
    goto LAB_00292eaf;
  case 0xc:
    *(char *)piVar10 = (char)*piVar10 + cVar7;
    if ((uVar9 | 0x20) == 0x78) goto LAB_00292f41;
    std::error_code::operator=((error_code *)CONCAT17(local_61,uStack_68),invalid_bigfloat);
    sVar15 = 2;
    goto LAB_00292eaf;
  case 0xd:
    *piVar10 = *piVar10 + uVar9;
    pp_Var3 = &this[-0x832303].bytestringref_map_._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
    *(char *)pp_Var3 = *(char *)pp_Var3 + cVar7;
    *(int *)(in_FS_OFFSET + (long)piVar10) = *(int *)(in_FS_OFFSET + (long)piVar10) + uVar9;
    DAT_0082ab48._3_1_ = cVar7;
    *piVar10 = *piVar10 + uVar9;
    *(char *)piVar10 = (char)*piVar10 + cVar7;
    std::__cxx11::string::push_back((char)&local_58);
    goto LAB_00292f41;
  case 0xe:
    if (uVar9 == 0x30) goto LAB_00292f41;
    std::error_code::operator=((error_code *)CONCAT17(local_61,uStack_68),invalid_bigfloat);
    sVar15 = 1;
    goto LAB_00292eaf;
  case 0xf:
    *(char *)piVar10 = (char)*piVar10 + cVar7;
    *(char *)&b->data_ = *(char *)&b->data_ + (char)((ulong)this >> 8);
    if ((uVar12 >> 0xc & 1) != 0) {
      std::__cxx11::string::push_back((char)&bs);
      sVar15 = 5;
      goto LAB_00292f41;
    }
    std::error_code::operator=((error_code *)CONCAT17(local_61,uStack_68),invalid_bigfloat);
    sVar15 = 5;
LAB_00292eaf:
    unaff_RBP = 0;
    goto LAB_00292f41;
  case 0x10:
    puVar2 = &(this->options_).field_0x15;
    *puVar2 = *puVar2 | bVar13;
    uVar8 = (*(code *)((long)&switchD_002972ec::switchdataD_0082abcc +
                      (long)(int)(&switchD_002972ec::switchdataD_0082abcc)[(long)piVar10]))();
    return (bool)uVar8;
  default:
    builtin_strncpy("ns4cbor17cbor_event_readerINS_13stream_sourceIhEESaIcEEE","ns4c",4);
    DAT_0082ab48._3_1_ = 0;
    halt_baddata();
  case 0x13:
    builtin_strncpy("ns4cbor17cbor_event_readerINS_13stream_sourceIhEESaIcEEE","ns4c",4);
    DAT_0082ab48._3_1_ = 0;
    halt_baddata();
  case 0x14:
  case 0x15:
    _Unwind_Resume();
  case 0x17:
    builtin_strncpy("ns4cbor17cbor_event_readerINS_13stream_sourceIhEESaIcEEE","ns4c",4);
    DAT_0082ab48._3_1_ = 0;
    return (bool)((char)uVar12 + bVar13 & 0x58 | 0x8c);
  case 0x18:
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)this);
    operator_delete(this,0x28);
    return (bool)extraout_AL_01;
  }
  if ((local_61 & 1) != 0) {
    binary_stream_sink::push_back((binary_stream_sink *)(local_48.second + 8),0xc4);
    visit_begin_array((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                      local_48.second,2,none,unaff_RBX,local_60);
    if (local_60->_M_value == 0) {
      if (unaff_R15 != 0) {
        tVar16 = detail::to_integer<long,char>(unaff_R14,unaff_R15,(long *)&stack0xffffffffffffffe0)
        ;
        bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)tVar16.ptr;
        bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = tVar16.ec;
        if ((to_integer_errc)
            bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != success) {
          eVar17 = detail::to_integer_result<long,_char>::error_code
                             ((to_integer_result<long,_char> *)
                              &bs.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
          local_60->_M_value = eVar17._M_value;
          local_60->_M_cat = eVar17._M_cat;
          goto LAB_00292be3;
        }
      }
      write_int64_value((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                        local_48.second,(int64_t)local_58);
      psVar6 = (((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                  *)(local_48.second + 0x68))->
               super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
             *)(local_48.second + 0x68))->
          super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
          )._M_impl.super__Vector_impl_data._M_start != psVar6) {
        psVar1 = &psVar6[-1].index_;
        *psVar1 = *psVar1 + 1;
      }
      if (local_60->_M_value == 0) {
        in_stack_00000038 = 0;
        tVar16 = detail::to_integer<long,char>
                           (local_50,(size_t)local_48.first.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                            &stack0x00000038);
        if (tVar16.ec == success) {
          write_int64_value((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>
                             *)local_48.second,in_stack_00000038);
          psVar6 = (((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                      *)(local_48.second + 0x68))->
                   super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if ((((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                 *)(local_48.second + 0x68))->
              super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
              )._M_impl.super__Vector_impl_data._M_start != psVar6) {
            psVar1 = &psVar6[-1].index_;
            *psVar1 = *psVar1 + 1;
          }
          if (local_60->_M_value != 0) goto LAB_00292be3;
        }
        else {
          eVar17 = detail::to_integer_result<long,_char>::error_code
                             ((to_integer_result<long,_char> *)&stack0xffffffffffffffe0);
          std::error_code::error_code<jsoncons::detail::to_integer_errc,void>
                    ((error_code *)
                     &bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish,overflow);
          if ((eVar17._M_cat !=
               (error_category *)
               CONCAT71(bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                        (to_integer_errc)
                        bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)) ||
             (eVar17._M_value !=
              (int)bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish)) {
            eVar17 = detail::to_integer_result<long,_char>::error_code
                               ((to_integer_result<long,_char> *)&stack0xffffffffffffffe0);
            local_60->_M_value = eVar17._M_value;
            local_60->_M_cat = eVar17._M_cat;
            goto LAB_00292be3;
          }
          basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
                    ((basic_bigint<std::allocator<unsigned_char>_> *)
                     &bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish,local_50,
                     (size_type)
                     local_48.first.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          write_bignum((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                       local_48.second,
                       (bigint *)
                       &bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
          psVar6 = (((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                      *)(local_48.second + 0x68))->
                   super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if ((((vector<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                 *)(local_48.second + 0x68))->
              super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
              )._M_impl.super__Vector_impl_data._M_start != psVar6) {
            psVar1 = &psVar6[-1].index_;
            *psVar1 = *psVar1 + 1;
          }
          if ((((to_integer_errc)
                bs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & overflow) != success) &&
             (in_stack_00000030 != (void *)0x0)) {
            operator_delete(in_stack_00000030,(long)in_stack_00000028 << 3);
          }
        }
        visit_end_array((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                        local_48.second,unaff_RBX,local_60);
      }
    }
  }
LAB_00292be3:
  basic_cbor_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::write_decimal_value();
  return (bool)extraout_AL;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                           semantic_tag tag, 
                           const ser_context&,
                           std::error_code&) override
    {
        byte_string_chars_format encoding_hint;
        switch (tag)
        {
            case semantic_tag::base16:
                encoding_hint = byte_string_chars_format::base16;
                break;
            case semantic_tag::base64:
                encoding_hint = byte_string_chars_format::base64;
                break;
            case semantic_tag::base64url:
                encoding_hint = byte_string_chars_format::base64url;
                break;
            default:
                encoding_hint = byte_string_chars_format::none;
                break;
        }
        switch (encoding_hint)
        {
            case byte_string_chars_format::base64url:
                write_tag(21);
                break;
            case byte_string_chars_format::base64:
                write_tag(22);
                break;
            case byte_string_chars_format::base16:
                write_tag(23);
                break;
            default:
                break;
        }
        if (options_.pack_strings() && b.size() >= jsoncons::cbor::detail::min_length_for_stringref(next_stringref_))
        {
            byte_string_type bs(b.data(), b.size(), alloc_);
            auto it = bytestringref_map_.find(bs);
            if (it == bytestringref_map_.end())
            {
                bytestringref_map_.emplace(std::make_pair(bs, next_stringref_++));
                write_byte_string(bs);
            }
            else
            {
                write_tag(25);
                write_uint64_value((*it).second);
            }
        }
        else
        {
            write_byte_string(b);
        }

        end_value();
        JSONCONS_VISITOR_RETURN;
    }